

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O0

size_t count_monsters(MyGame_Example_Monster_vec_t monsters,char *name)

{
  undefined8 local_28;
  size_t count;
  size_t i;
  char *name_local;
  MyGame_Example_Monster_vec_t monsters_local;
  
  local_28 = 0;
  for (count = MyGame_Example_Monster_vec_scan(monsters,name); count != 0xffffffffffffffff;
      count = MyGame_Example_Monster_vec_scan_ex(monsters,count + 1,0xffffffffffffffff,name)) {
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

static size_t count_monsters(ns(Monster_vec_t) monsters, const char *name)
{
    size_t i;
    size_t count = 0;

    for (i = ns(Monster_vec_scan)(monsters, name);
         i != nsc(not_found);
         i = ns(Monster_vec_scan_ex)(monsters, i + 1, nsc(end), name)) {
        ++count;
    }

    return count;
}